

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationX.hpp
# Opt level: O2

RotationX<std::complex<float>_> *
qclab::qgates::operator/
          (RotationX<std::complex<float>_> *__return_storage_ptr__,
          RotationX<std::complex<float>_> *lhs,RotationX<std::complex<float>_> *rhs)

{
  int iVar1;
  int iVar2;
  
  iVar1 = (lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
          qubit_;
  iVar2 = (*(rhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
            super_QObject<std::complex<float>_>._vptr_QObject[3])(rhs);
  if (iVar1 == iVar2) {
    RotationX<std::complex<float>_>::operator/=(lhs,rhs);
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).
    super_QGate1<std::complex<float>_>.qubit_ =
         (lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.qubit_
    ;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).
    super_QGate1<std::complex<float>_>.field_0xc =
         (lhs->super_QRotationGate1<std::complex<float>_>).super_QGate1<std::complex<float>_>.
         field_0xc;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).rotation_.angle_ =
         (lhs->super_QRotationGate1<std::complex<float>_>).rotation_.angle_;
    (__return_storage_ptr__->super_QRotationGate1<std::complex<float>_>).
    super_QGate1<std::complex<float>_>.super_QObject<std::complex<float>_>._vptr_QObject =
         (_func_int **)&PTR_nbQubits_004cd810;
    return __return_storage_ptr__;
  }
  __assert_fail("lhs.qubit() == rhs.qubit()",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/include/qclab/qgates/RotationX.hpp"
                ,0xba,"RotationX<T> qclab::qgates::operator/(RotationX<T>, const RotationX<T> &)");
}

Assistant:

RotationX< T > operator/( RotationX< T > lhs ,
                                         const RotationX< T >& rhs ) {
          assert( lhs.qubit() == rhs.qubit() ) ;
          lhs /= rhs ;
          return lhs ;
        }